

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntCheckUniqueSmall(Vec_Int_t *p)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar2 = p->nSize;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  lVar5 = 1;
  uVar4 = 0;
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    lVar6 = lVar5;
    while ((int)lVar6 < (int)uVar2) {
      piVar1 = p->pArray + lVar6;
      lVar6 = lVar6 + 1;
      if (p->pArray[uVar4] == *piVar1) {
        return 0;
      }
    }
    lVar5 = lVar5 + 1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static inline int Vec_IntCheckUniqueSmall( Vec_Int_t * p )
{
    int i, k;
    for ( i = 0; i < p->nSize; i++ )
        for ( k = i+1; k < p->nSize; k++ )
            if ( p->pArray[i] == p->pArray[k] )
                return 0;
    return 1;
}